

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

void __thiscall CCharmapToLocal8859_1::CCharmapToLocal8859_1(CCharmapToLocal8859_1 *this)

{
  uchar *puVar1;
  uint *puVar2;
  int iVar3;
  long lVar4;
  
  (this->super_CCharmapToLocalSB).super_CCharmapToLocal.super_CCharmap.ref_cnt_ = 1;
  (this->super_CCharmapToLocalSB).super_CCharmapToLocal.exp_array_ = (wchar_t *)0x0;
  lVar4 = 0;
  memset((this->super_CCharmapToLocalSB).super_CCharmapToLocal.map_ + 1,0,0xff8);
  (this->super_CCharmapToLocalSB).super_CCharmapToLocal.super_CCharmap._vptr_CCharmap =
       (_func_int **)&PTR__CCharmapToLocal_0030a400;
  puVar1 = (uchar *)malloc(0x202);
  (this->super_CCharmapToLocalSB).super_CCharmapToLocal.xlat_array_ = puVar1;
  puVar2 = (uint *)malloc(0x400);
  (this->super_CCharmapToLocalSB).super_CCharmapToLocal.map_[0] = puVar2;
  do {
    (this->super_CCharmapToLocalSB).super_CCharmapToLocal.map_[0][lVar4] = 0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  *(this->super_CCharmapToLocalSB).super_CCharmapToLocal.map_[0] = 0;
  puVar1[0] = '\x01';
  puVar1[1] = '?';
  iVar3 = (int)puVar1;
  lVar4 = 0;
  do {
    iVar3 = iVar3 + 2;
    CCharmapToLocal::set_mapping
              ((CCharmapToLocal *)this,(wchar_t)lVar4,
               iVar3 - *(int *)&(this->super_CCharmapToLocalSB).super_CCharmapToLocal.xlat_array_);
    puVar1[lVar4 * 2 + 2] = '\x01';
    puVar1[lVar4 * 2 + 3] = (uchar)lVar4;
    lVar4 = lVar4 + 1;
  } while ((int)lVar4 != 0x100);
  return;
}

Assistant:

CCharmapToLocal8859_1::CCharmapToLocal8859_1()
{
    unsigned char *dst;
    size_t siz;
    wchar_t c;

    /* 
     *   Determine how much space we'll need in the translation array - we
     *   need one byte for each character, plus one byte for the length of
     *   each character.  We also need two bytes for the default entry.  
     */
    siz = 256 + 256 + 2;

    /* allocate the mapping */
    xlat_array_ = (unsigned char *)t3malloc(siz);

    /* start at the start of the array */
    dst = xlat_array_;

    /* 
     *   Add the zeroeth entry, which serves as the default mapping for
     *   characters that aren't otherwise mappable.  
     */
    set_mapping(0, 0);
    *dst++ = 1;
    *dst++ = '?';

    /* 
     *   Set up the mappings - this is easy because each Unicode code point
     *   from 0 to 255 maps to the same ISO 8859-1 code point.  
     */
    for (c = 0 ; c < 256 ; ++c)
    {
        /* set the mapping's offset in the translation array */
        set_mapping(c, dst - xlat_array_);

        /* store the length (always 1) and translated character */
        *dst++ = 1;
        *dst++ = (unsigned char)c;
    }
}